

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

bool __thiscall
nuraft::asio_rpc_client::handle_custom_resp_meta
          (asio_rpc_client *this,ptr<req_msg> *req,ptr<resp_msg> *rsp,rpc_handler *when_done,
          string *meta_str)

{
  bool bVar1;
  int32 iVar2;
  element_type *this_00;
  shared_ptr<nuraft::req_msg> *args_1;
  shared_ptr<nuraft::resp_msg> *__args;
  asio_rpc_client *in_RDI;
  ptr<rpc_exception> except;
  ptr<resp_msg> rsp_1;
  bool meta_ok;
  undefined4 in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  asio_service_meta_cb_params *in_stack_fffffffffffffed8;
  int args;
  ptr<req_msg> *in_stack_ffffffffffffff10;
  
  asio_service_impl::get_options(in_RDI->impl_);
  req_to_params(in_stack_ffffffffffffff10);
  bVar1 = std::
          function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()((function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)in_RDI,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  args = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  if (!bVar1) {
    std::shared_ptr<nuraft::resp_msg>::shared_ptr((shared_ptr<nuraft::resp_msg> *)0x4082d3);
    strfmt<100>::strfmt((strfmt<100> *)&stack0xffffffffffffff00,
                        "response meta verification failed: from peer %d, %s:%s");
    this_00 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4082f3);
    iVar2 = msg_base::get_dst(&this_00->super_msg_base);
    args_1 = (shared_ptr<nuraft::req_msg> *)std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    __args = (shared_ptr<nuraft::resp_msg> *)
             strfmt<100>::fmt<int,char_const*,char_const*>
                       ((strfmt<100> *)in_RDI,args,(char *)args_1,
                        (char *)CONCAT44(iVar2,in_stack_fffffffffffffec8));
    cs_new<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((char **)__args,args_1);
    close_socket(in_RDI);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)in_RDI,__args,(shared_ptr<nuraft::rpc_exception> *)args_1);
    std::shared_ptr<nuraft::rpc_exception>::~shared_ptr
              ((shared_ptr<nuraft::rpc_exception> *)0x4083ad);
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x4083ba);
  }
  return bVar1;
}

Assistant:

bool handle_custom_resp_meta(ptr<req_msg>& req,
                                 ptr<resp_msg>& rsp,
                                 rpc_handler& when_done,
                                 const std::string& meta_str)
    {
        bool meta_ok = impl_->get_options().read_resp_meta_
                       ( req_to_params(req), meta_str );

        if (!meta_ok) {
            // Callback function returns false, should return failure.
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt( "response meta verification failed: "
                             "from peer %d, %s:%s")
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str() ),
                    req ) );
            close_socket();
            when_done(rsp, except);
            return false;
        }
        return true;
    }